

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall
spv::Builder::createConditionalBranch(Builder *this,Id condition,Block *thenBlock,Block *elseBlock)

{
  Id IVar1;
  Instruction *pIVar2;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_38;
  Instruction *local_30;
  Instruction *branch;
  Block *elseBlock_local;
  Block *thenBlock_local;
  Builder *pBStack_10;
  Id condition_local;
  Builder *this_local;
  
  branch = (Instruction *)elseBlock;
  elseBlock_local = thenBlock;
  thenBlock_local._4_4_ = condition;
  pBStack_10 = this;
  pIVar2 = (Instruction *)::operator_new(0x60);
  spv::Instruction::Instruction(pIVar2,OpBranchConditional);
  local_30 = pIVar2;
  spv::Instruction::reserveOperands(pIVar2,3);
  spv::Instruction::addIdOperand(local_30,thenBlock_local._4_4_);
  pIVar2 = local_30;
  IVar1 = Block::getId(elseBlock_local);
  spv::Instruction::addIdOperand(pIVar2,IVar1);
  pIVar2 = local_30;
  IVar1 = Block::getId((Block *)branch);
  spv::Instruction::addIdOperand(pIVar2,IVar1);
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_38,
             local_30);
  addInstructionNoDebugInfo(this,&local_38);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_38);
  Block::addPredecessor(elseBlock_local,this->buildPoint);
  Block::addPredecessor((Block *)branch,this->buildPoint);
  return;
}

Assistant:

void Builder::createConditionalBranch(Id condition, Block* thenBlock, Block* elseBlock)
{
    Instruction* branch = new Instruction(OpBranchConditional);
    branch->reserveOperands(3);
    branch->addIdOperand(condition);
    branch->addIdOperand(thenBlock->getId());
    branch->addIdOperand(elseBlock->getId());

    // A conditional branch is always attached to a condition expression
    addInstructionNoDebugInfo(std::unique_ptr<Instruction>(branch));

    thenBlock->addPredecessor(buildPoint);
    elseBlock->addPredecessor(buildPoint);
}